

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall capnp::_::BuilderArena::~BuilderArena(BuilderArena *this)

{
  BuilderArena *this_local;
  
  ~BuilderArena(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

BuilderArena::~BuilderArena() noexcept(false) {}